

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charset_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::true_matcher>>
          (charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,matcher_wrapper<boost::xpressive::detail::true_matcher> *next)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *prVar4;
  matcher_wrapper<boost::xpressive::detail::true_matcher> *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  undefined6 in_stack_ffffffffffffffd8;
  byte bVar5;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 local_1;
  
  bVar2 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eos(in_RDI);
  bVar5 = 1;
  if (!bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(in_RSI);
    cVar1 = *pcVar3;
    prVar4 = traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x17b57e);
    bVar2 = compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::test<mpl_::bool_<false>>
                      ((compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                        *)in_RDI,(int)cVar1,prVar4);
    bVar5 = bVar2 ^ 0xff;
  }
  if ((bVar5 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_RSI);
    bVar2 = matcher_wrapper<boost::xpressive::detail::true_matcher>::
            match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (in_RDX,(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffdf,
                                          CONCAT16(bVar5,in_stack_ffffffffffffffd8)));
    if (bVar2) {
      local_1 = true;
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(in_RSI);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || !this->charset_.test(*state.cur_, traits_cast<Traits>(state), icase_type()))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }